

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void WriteIndentChar(TidyDocImpl *doc)

{
  uint uVar1;
  uint local_20;
  uint tabsize;
  uint spaces;
  uint i;
  TidyPrintImpl *pprint;
  TidyDocImpl *doc_local;
  
  local_20 = GetSpaces(&doc->pprint);
  uVar1 = (uint)(doc->config).value[0x53].v;
  if ((((local_20 != 0) && (indent_char == 9)) && (uVar1 != 0)) &&
     (local_20 = local_20 / uVar1, local_20 == 0)) {
    local_20 = 1;
  }
  for (tabsize = 0; tabsize < local_20; tabsize = tabsize + 1) {
    prvTidyWriteChar(indent_char,doc->docOut);
  }
  return;
}

Assistant:

static void WriteIndentChar(TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;
    uint i;
    uint spaces = GetSpaces(pprint);
    uint tabsize = cfg(doc, TidyTabSize);
    if (spaces && (indent_char == '\t') && tabsize)
    {
        spaces /= tabsize;  // set number of tabs to output
        if (spaces == 0)    // with a minimum of one
            spaces = 1;
    }
    for (i = 0; i < spaces; i++)
        TY_(WriteChar)(indent_char, doc->docOut); /* 20150515 - Issue #108 */

}